

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O3

MethodHandle * __thiscall
jsonrpccxx::createMethodHandle<bool,std::vector<product,std::allocator<product>>const&,0ul>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this)

{
  _Any_data local_30;
  _Manager_type local_20;
  
  std::function<bool_(const_std::vector<product,_std::allocator<product>_>_&)>::function
            ((function<bool_(const_std::vector<product,_std::allocator<product>_>_&)> *)&local_30,
             (function<bool_(const_std::vector<product,_std::allocator<product>_>_&)> *)this);
  std::
  function<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)>
  ::
  function<jsonrpccxx::createMethodHandle<bool,std::vector<product,std::allocator<product>>const&,0ul>(std::function<bool(std::vector<product,std::allocator<product>>const&)>,std::integer_sequence<unsigned_long,0ul>)::_lambda(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)_1_,void>
            ((function<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)>
              *)__return_storage_ptr__,(anon_class_32_1_60e9c21f *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

MethodHandle createMethodHandle(std::function<ReturnType(ParamTypes...)> method, std::index_sequence<index...>) {
    MethodHandle handle = [method](const json &params) -> json {
      size_t actualSize = params.size();
      size_t formalSize = sizeof...(ParamTypes);
      // TODO: add lenient mode for backwards compatible additional params
      if (actualSize != formalSize) {
        throw JsonRpcException(invalid_params, "invalid parameter: expected " + std::to_string(formalSize) + " argument(s), but found " + std::to_string(actualSize));
      }
      (check_param_type<typename std::decay<ParamTypes>::type>(index, params[index], GetType(type<typename std::decay<ParamTypes>::type>())), ...);
      return method(params[index].get<typename std::decay<ParamTypes>::type>()...);
    };
    return handle;
  }